

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void __thiscall gimage::Histogram::visualize(Histogram *this,ImageU8 *image,unsigned_long maxval)

{
  size_t sVar1;
  int k;
  uint uVar2;
  long lVar3;
  size_t __n;
  long lVar4;
  int i_1;
  
  if ((long)*(int *)(this + 4) < 2) {
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              (image,(long)*(int *)this,0x100,1);
    sVar1 = image->n;
    __n = -sVar1;
    if (0 < (long)sVar1) {
      __n = sVar1;
    }
    memset(image->pixel,0,__n);
    for (lVar3 = 0; lVar3 < *(int *)this; lVar3 = lVar3 + 1) {
      for (uVar2 = 0xff - (int)((ulong)(*(long *)(*(long *)(this + 0x10) + lVar3 * 8) * 0xff) /
                               maxval); -1 < (int)uVar2; uVar2 = uVar2 - 1) {
        (*image->img)[uVar2][lVar3] = 0xff;
      }
    }
  }
  else {
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              (image,(long)*(int *)this,(long)*(int *)(this + 4),1);
    for (lVar3 = 0; lVar3 < *(int *)(this + 4); lVar3 = lVar3 + 1) {
      for (lVar4 = 0; lVar4 < *(int *)this; lVar4 = lVar4 + 1) {
        (*image->img)[lVar3][lVar4] =
             ~(byte)((ulong)(*(long *)(*(long *)(*(long *)(this + 0x18) + lVar3 * 8) + lVar4 * 8) *
                            0xff) / maxval);
      }
    }
  }
  return;
}

Assistant:

void Histogram::visualize(ImageU8 &image, unsigned long maxval) const
{
  if (h > 1)
  {
    image.setSize(w, h, 1);

    for (int k=0; k<h; k++)
    {
      for (int i=0; i<w; i++)
      {
        image.set(i, k, 0, static_cast<unsigned char>(255-255*row[k][i]/maxval));
      }
    }
  }
  else
  {
    image.setSize(w, 256, 1);
    image.clear();

    for (int i=0; i<w; i++)
    {
      int k=255-255*val[i]/maxval;

      while (k >= 0)
      {
        image.set(i, k--, 0, 255);
      }
    }
  }
}